

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,uchar value)

{
  byte bVar1;
  Debug *pDVar2;
  int value_00;
  undefined7 in_register_00000031;
  char *value_01;
  char *shade;
  int v;
  char *local_38;
  int local_2c;
  
  value_00 = (int)CONCAT71(in_register_00000031,value);
  bVar1 = (this->_immediateFlags)._value | (this->_flags)._value;
  local_2c = value_00;
  if ((bVar1 & 0x10) == 0) {
    this = print<int>(this,&local_2c);
  }
  else {
    if (value < 0x33) {
      value_01 = "  ";
    }
    else if (value < 0x66) {
      value_01 = anon_var_dwarf_24776;
    }
    else if (value < 0x99) {
      value_01 = anon_var_dwarf_2478d;
    }
    else if (value < 0xcc) {
      value_01 = anon_var_dwarf_24798;
    }
    else {
      value_01 = anon_var_dwarf_247a3;
    }
    local_38 = value_01;
    if ((bVar1 & 2) == 0) {
      print<char[8]>(this,(char (*) [8])"\x1b[38;2;");
      bVar1 = (this->_flags)._value;
      (this->_flags)._value = bVar1 | 4;
      pDVar2 = operator<<(this,value_00);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,value_00);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,value_00);
      pDVar2 = operator<<(pDVar2,"m\x1b[48;2;");
      pDVar2 = operator<<(pDVar2,value_00);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,value_00);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,value_00);
      pDVar2 = operator<<(pDVar2,"m");
      pDVar2 = operator<<(pDVar2,value_01);
      operator<<(pDVar2,"\x1b[0m");
      (this->_flags)._value = bVar1;
    }
    else {
      this = print<char_const*>(this,&local_38);
    }
  }
  return this;
}

Assistant:

Debug& Debug::operator<<(unsigned char value) {
    /* Convert to int to avoid infinite recursion to operator<<(unsigned char) */
    const int v = value;

    /* Print the value as a shade of gray */
    if((_immediateFlags|_flags) & Flag::Color) {
        const char* shade;
        if(value < 51)       shade = "  ";
        else if(value < 102) shade = "░░";
        else if(value < 153) shade = "▒▒";
        else if(value < 204) shade = "▓▓";
        else                 shade = "██";

        /* If ANSI colors are disabled, use just the shade */
        if((_immediateFlags|_flags) & Flag::DisableColors)
            return print(shade);
        else {
            print("\033[38;2;");

            /* Disable space between values for everything after the initial
               value */
            const Flags previousFlags = _flags;
            _flags = previousFlags|Flag::NoSpace;

            /* Set both background and foreground, reset back after */
            *this << v << ";" << v << ";" << v << "m\033[48;2;"
                << v << ";" << v << ";" << v << "m" << shade << "\033[0m";

            /* Reset original flags */
            _flags = previousFlags;
            return *this;
        }

    /* Otherwise print its numeric value */
    } else return print(v);
}